

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::stateDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *param_2,TimeIndex param_3)

{
  _func_int **pp_Var1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _func_int *p_Var9;
  char cVar10;
  PointerType ptr;
  _func_int **pp_Var11;
  ulong uVar12;
  char *__function;
  uint uVar13;
  Index extraout_RDX;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar17;
  double dVar18;
  double dVar20;
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  Vector VVar27;
  Vector xk1;
  Vector3 angularVelocityFlex;
  Vector3 velocityFlex;
  Vector3 positionFlex;
  Vector3 orientationFlexV;
  Vector3 angularAccelerationFlex;
  Vector3 accelerationFlex;
  Quaternion orientationFlex;
  AngleAxis orientationAA;
  DenseStorage<double,__1,__1,_1,_0> local_228;
  undefined1 local_218 [12];
  undefined4 uStack_20c;
  _func_int *local_208;
  undefined1 local_1f8 [12];
  undefined4 uStack_1ec;
  _func_int *local_1e8;
  _func_int *local_1d8;
  _func_int *p_Stack_1d0;
  _func_int *local_1c8;
  Vector3 local_1b8;
  double local_1a0;
  _func_int *local_198;
  _func_int *p_Stack_190;
  double local_188;
  double dStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  double local_148;
  double local_138 [4];
  double local_118;
  double dStack_110;
  Quaternion local_108;
  double local_e8;
  double dStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  AngleAxis<double> local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  _func_int *local_88;
  _func_int *p_Stack_80;
  _func_int *local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _func_int *local_58;
  _func_int *local_48;
  _func_int *p_Stack_40;
  _func_int *local_38;
  
  cVar10 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,param_2);
  if (cVar10 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar2 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (2 < lVar2) {
    pdVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    local_1d8 = (_func_int *)*pdVar3;
    p_Stack_1d0 = (_func_int *)pdVar3[1];
    local_1c8 = (_func_int *)pdVar3[2];
    local_168._0_8_ = local_1c8;
    local_198 = local_1d8;
    p_Stack_190 = p_Stack_1d0;
    if (lVar2 - 9U < 0xfffffffffffffffa) {
      local_188 = *(double *)*(undefined1 (*) [16])(pdVar3 + 6);
      dStack_180 = pdVar3[7];
      local_1e8 = (_func_int *)pdVar3[8];
      local_178._0_8_ = local_1e8;
      local_1f8._0_4_ = SUB84(local_188,0);
      local_1f8._4_4_ = (undefined4)((ulong)local_188 >> 0x20);
      local_1f8._8_4_ = SUB84(dStack_180,0);
      uStack_1ec = (undefined4)((ulong)dStack_180 >> 0x20);
      local_68 = local_1f8._0_4_;
      uStack_64 = local_1f8._4_4_;
      uStack_60 = local_1f8._8_4_;
      uStack_5c = uStack_1ec;
      _local_1f8 = *(undefined1 (*) [16])(pdVar3 + 6);
      local_58 = local_1e8;
      local_48 = local_1d8;
      p_Stack_40 = p_Stack_1d0;
      local_38 = local_1c8;
      (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                [10])(local_138,x);
      lVar2 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
      if (5 < lVar2) {
        pdVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar3[3];
        local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar3[4];
        local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar3[5];
        if (lVar2 - 0xcU < 0xfffffffffffffff7) {
          local_118 = *(double *)*(undefined1 (*) [16])(pdVar3 + 9);
          dStack_110 = pdVar3[10];
          local_208 = (_func_int *)pdVar3[0xb];
          local_218._0_4_ = SUB84(local_118,0);
          local_218._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
          local_218._8_4_ = SUB84(dStack_110,0);
          uStack_20c = (undefined4)((ulong)dStack_110 >> 0x20);
          local_a8 = local_218._0_4_;
          uStack_a4 = local_218._4_4_;
          uStack_a0 = local_218._8_4_;
          uStack_9c = uStack_20c;
          _local_218 = *(undefined1 (*) [16])(pdVar3 + 9);
          local_1a0 = (double)local_208;
          local_98 = (double)local_208;
          local_88 = (_func_int *)
                     local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          p_Stack_80 = (_func_int *)
                       local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1];
          local_78 = (_func_int *)
                     local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[0xb])(&local_158,x);
          computeQuaternion_(&local_108,(StableIMUFixedContactDynamicalSystem *)x,&local_1b8);
          local_e8 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
          dVar23 = local_e8 * 0.5 * local_e8;
          local_1d8 = (_func_int *)
                      ((double)local_198 + local_138[0] * dVar23 + local_188 * local_e8);
          p_Stack_1d0 = (_func_int *)
                        ((double)p_Stack_190 + local_138[1] * dVar23 + dStack_180 * local_e8);
          local_1c8 = (_func_int *)
                      ((double)local_168._0_8_ +
                      dVar23 * local_138[2] + (double)local_178._0_8_ * local_e8);
          dStack_180 = local_138[1] * local_e8 + dStack_180;
          local_1f8._8_4_ = SUB84(dStack_180,0);
          local_1f8._0_8_ = local_138[0] * local_e8 + local_188;
          uStack_1ec = (int)((ulong)dStack_180 >> 0x20);
          local_1e8 = (_func_int *)(local_138[2] * local_e8 + (double)local_178._0_8_);
          auVar26._0_8_ = dVar23 * local_158 + local_118 * local_e8;
          auVar26._8_8_ = dVar23 * uStack_150 + dStack_110 * local_e8;
          dVar24 = dVar23 * local_148 + local_1a0 * local_e8;
          dVar17 = dVar24 * dVar24 + auVar26._8_8_ * auVar26._8_8_ + auVar26._0_8_ * auVar26._0_8_;
          dVar23 = SQRT(dVar17);
          if (9.999999999999999e-33 < dVar17) {
            auVar5._8_8_ = dVar23;
            auVar5._0_8_ = dVar23;
            local_168 = divpd(auVar26,auVar5);
          }
          else {
            local_168 = ZEXT816(0);
          }
          uStack_d0 = 0;
          if (9.999999999999999e-33 < dVar17) {
            local_198 = (_func_int *)(dVar24 / dVar23);
          }
          else {
            local_198 = (_func_int *)0x3ff0000000000000;
          }
          p_Stack_190 = (_func_int *)0x0;
          local_188 = (double)(-(ulong)(9.999999999999999e-33 < dVar17) & (ulong)(dVar23 * 0.5));
          dStack_180 = 0.0;
          dStack_e0 = local_e8;
          local_d8 = local_e8;
          dVar23 = cos(local_188);
          local_178._8_4_ = extraout_XMM0_Dc;
          local_178._0_8_ = dVar23;
          local_178._12_4_ = extraout_XMM0_Dd;
          dVar23 = sin(local_188);
          dVar25 = (double)local_198 * dVar23;
          dVar17 = dVar23 * (double)local_168._0_8_;
          dVar23 = dVar23 * (double)local_168._8_8_;
          dVar24 = dVar23 * local_108.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0];
          dVar4 = dVar23 * local_108.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar18 = dVar17 * local_108.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0];
          dVar20 = dVar17 * local_108.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[1];
          dVar21 = local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar25 -
                   local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[2] * dVar17;
          auVar22._8_4_ = SUB84(dVar21,0);
          auVar22._0_8_ =
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * dVar25 -
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar17;
          auVar22._12_4_ = (int)((ulong)dVar21 >> 0x20);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[0] =
               SUB168(auVar22 ^ _DAT_001987c0,0) +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[2] * dVar23 +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0] * (double)local_178._0_8_;
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[1] =
               SUB168(auVar22 ^ _DAT_001987c0,8) +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar23 +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * (double)local_178._0_8_;
          dVar18 = dVar18 + dVar25 * local_108.m_coeffs.
                                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                     m_storage.m_data.array[2];
          auVar19._8_4_ = SUB84(dVar18,0);
          auVar19._0_8_ =
               dVar20 + dVar25 * local_108.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[3];
          auVar19._12_4_ = (int)((ulong)dVar18 >> 0x20);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[2] =
               SUB168(auVar19 ^ _DAT_001987d0,0) +
               ((double)local_178._0_8_ *
                local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2] - dVar24);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[3] =
               SUB168(auVar19 ^ _DAT_001987d0,8) +
               ((double)local_178._0_8_ *
                local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[3] - dVar4);
          dVar23 = dStack_110 + dStack_e0 * uStack_150;
          local_218._8_4_ = SUB84(dVar23,0);
          local_218._0_8_ = local_118 + local_e8 * local_158;
          uStack_20c = (int)((ulong)dVar23 >> 0x20);
          local_208 = (_func_int *)(local_1a0 + local_d8 * local_148);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    (&local_228,(DenseStorage<double,__1,__1,_1,_0> *)param_2);
          pdVar3 = local_228.m_data;
          if (2 < local_228.m_rows) {
            if (((ulong)local_228.m_data & 7) == 0) {
              bVar16 = ((ulong)local_228.m_data & 8) != 0;
              if (bVar16) {
                *local_228.m_data = (double)local_1d8;
                uVar13 = 3;
              }
              else {
                uVar13 = 2;
              }
              uVar15 = bVar16 | 2;
              if ((bVar16 | 2) < uVar13) {
                uVar15 = uVar13;
              }
              memcpy((void *)((long)local_228.m_data + (ulong)((uint)bVar16 * 8)),
                     (void *)((long)&local_1d8 + (ulong)((uint)bVar16 * 8)),
                     (ulong)((uVar15 + ~(uint)bVar16) * 8 & 0xfffffff0) + 0x10);
              if (((ulong)pdVar3 & 8) == 0) {
                uVar12 = (ulong)(uVar13 << 3);
                memcpy((void *)((long)pdVar3 + uVar12),(void *)((long)&local_1d8 + uVar12),
                       uVar12 ^ 0x18);
              }
            }
            else {
              local_228.m_data[2] = (double)local_1c8;
              *local_228.m_data = (double)local_1d8;
              local_228.m_data[1] = (double)p_Stack_1d0;
            }
            pdVar3 = local_228.m_data;
            if (8 < local_228.m_rows) {
              pp_Var11 = (_func_int **)(local_228.m_data + 6);
              if (((ulong)pp_Var11 & 7) == 0) {
                bVar16 = ((ulong)pp_Var11 & 8) != 0;
                if (bVar16) {
                  *pp_Var11 = (_func_int *)local_1f8._0_8_;
                  uVar13 = 3;
                }
                else {
                  uVar13 = 2;
                }
                uVar15 = bVar16 | 2;
                if ((bVar16 | 2) < uVar13) {
                  uVar15 = uVar13;
                }
                memcpy((void *)((long)local_228.m_data + (ulong)((uint)bVar16 * 8) + 0x30),
                       local_1f8 + (uint)bVar16 * 8,
                       (ulong)((uVar15 + ~(uint)bVar16) * 8 & 0xfffffff0) + 0x10);
                if (((ulong)pp_Var11 & 8) == 0) {
                  uVar12 = (ulong)(uVar13 << 3);
                  memcpy((void *)((long)pdVar3 + uVar12 + 0x30),local_1f8 + uVar12,uVar12 ^ 0x18);
                }
              }
              else {
                local_228.m_data[8] = (double)local_1e8;
                *pp_Var11 = (_func_int *)local_1f8._0_8_;
                local_228.m_data[7] = (double)stack0xfffffffffffffe10;
              }
              if (0xe < local_228.m_rows) {
                pp_Var11 = (_func_int **)(local_228.m_data + 0xc);
                if (((ulong)pp_Var11 & 7) == 0) {
                  if (((ulong)pp_Var11 >> 3 & 1) != 0) {
                    uVar13 = (uint)((ulong)pp_Var11 >> 3) & 1 ^ 3;
                    uVar12 = 1;
                    goto LAB_001565a0;
                  }
                  uVar14 = 2;
                  bVar16 = true;
                  uVar12 = 0;
LAB_001565c5:
                  do {
                    p_Var9 = (_func_int *)local_138[uVar12 + 1];
                    pp_Var11[uVar12] = (_func_int *)local_138[uVar12];
                    (pp_Var11 + uVar12)[1] = p_Var9;
                    uVar12 = uVar12 + 2;
                  } while (uVar12 < uVar14);
                  if (bVar16) {
                    do {
                      pp_Var11[uVar14] = (_func_int *)local_138[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != 3);
                  }
                }
                else {
                  uVar12 = 3;
                  uVar13 = 0;
LAB_001565a0:
                  uVar14 = 0;
                  do {
                    pp_Var11[uVar14] = (_func_int *)local_138[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar12 != uVar14);
                  if (1 < uVar13) {
                    uVar14 = 3;
                    bVar16 = false;
                    goto LAB_001565c5;
                  }
                }
                Eigen::AngleAxis<double>::operator=
                          (&local_c8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_108);
                pdVar3 = local_228.m_data;
                local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
                local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
                local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
                if (5 < local_228.m_rows) {
                  pp_Var11 = (_func_int **)(local_228.m_data + 3);
                  if (((ulong)pp_Var11 & 7) == 0) {
                    bVar16 = ((ulong)pp_Var11 & 8) != 0;
                    if (bVar16) {
                      *pp_Var11 = (_func_int *)
                                  local_1b8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0];
                      uVar13 = 3;
                    }
                    else {
                      uVar13 = 2;
                    }
                    uVar15 = bVar16 | 2;
                    if ((bVar16 | 2) < uVar13) {
                      uVar15 = uVar13;
                    }
                    memcpy((void *)((long)local_228.m_data + (ulong)((uint)bVar16 * 8) + 0x18),
                           (void *)((long)local_1b8.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array + (ulong)((uint)bVar16 * 8)),
                           (ulong)((uVar15 + ~(uint)bVar16) * 8 & 0xfffffff0) + 0x10);
                    if (((ulong)pp_Var11 & 8) == 0) {
                      uVar12 = (ulong)(uVar13 << 3);
                      memcpy((void *)((long)pdVar3 + uVar12 + 0x18),
                             (void *)((long)local_1b8.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                            .m_storage.m_data.array + uVar12),uVar12 ^ 0x18);
                    }
                  }
                  else {
                    local_228.m_data[5] =
                         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2];
                    *pp_Var11 = (_func_int *)
                                local_1b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0];
                    local_228.m_data[4] =
                         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
                  }
                  pdVar3 = local_228.m_data;
                  if (0xb < local_228.m_rows) {
                    pp_Var11 = (_func_int **)(local_228.m_data + 9);
                    if (((ulong)pp_Var11 & 7) == 0) {
                      bVar16 = ((ulong)pp_Var11 & 8) != 0;
                      if (bVar16) {
                        *pp_Var11 = (_func_int *)local_218._0_8_;
                        uVar13 = 3;
                      }
                      else {
                        uVar13 = 2;
                      }
                      uVar15 = bVar16 | 2;
                      if ((bVar16 | 2) < uVar13) {
                        uVar15 = uVar13;
                      }
                      memcpy((void *)((long)local_228.m_data + (ulong)((uint)bVar16 * 8) + 0x48),
                             local_218 + (uint)bVar16 * 8,
                             (ulong)((uVar15 + ~(uint)bVar16) * 8 & 0xfffffff0) + 0x10);
                      if (((ulong)pp_Var11 & 8) == 0) {
                        uVar12 = (ulong)(uVar13 << 3);
                        memcpy((void *)((long)pdVar3 + uVar12 + 0x48),local_218 + uVar12,
                               uVar12 ^ 0x18);
                      }
                    }
                    else {
                      local_228.m_data[0xb] = (double)local_208;
                      *pp_Var11 = (_func_int *)local_218._0_8_;
                      local_228.m_data[10] = (double)stack0xfffffffffffffdf0;
                    }
                    if (0x11 < local_228.m_rows) {
                      pp_Var11 = (_func_int **)(local_228.m_data + 0xf);
                      if (((ulong)pp_Var11 & 7) == 0) {
                        if (((ulong)pp_Var11 >> 3 & 1) != 0) {
                          uVar13 = (uint)((ulong)pp_Var11 >> 3) & 1 ^ 3;
                          uVar12 = 1;
                          goto LAB_001567f4;
                        }
                        uVar14 = 2;
                        bVar16 = true;
                        uVar12 = 0;
                      }
                      else {
                        uVar12 = 3;
                        uVar13 = 0;
LAB_001567f4:
                        uVar14 = 0;
                        do {
                          pp_Var11[uVar14] = (_func_int *)(&local_158)[uVar14];
                          uVar14 = uVar14 + 1;
                        } while (uVar12 != uVar14);
                        if (uVar13 < 2) goto LAB_0015684c;
                        uVar14 = 3;
                        bVar16 = false;
                      }
                      do {
                        uVar6 = *(undefined4 *)((long)&local_158 + uVar12 * 8 + 4);
                        uVar7 = *(undefined4 *)(&uStack_150 + uVar12);
                        uVar8 = *(undefined4 *)((long)&uStack_150 + uVar12 * 8 + 4);
                        pp_Var1 = pp_Var11 + uVar12;
                        *(undefined4 *)pp_Var1 = *(undefined4 *)(&local_158 + uVar12);
                        *(undefined4 *)((long)pp_Var1 + 4) = uVar6;
                        *(undefined4 *)(pp_Var1 + 1) = uVar7;
                        *(undefined4 *)((long)pp_Var1 + 0xc) = uVar8;
                        uVar12 = uVar12 + 2;
                      } while (uVar12 < uVar14);
                      if (bVar16) {
                        do {
                          pp_Var11[uVar14] = (_func_int *)(&local_158)[uVar14];
                          uVar14 = uVar14 + 1;
                        } while (uVar14 != 3);
                      }
LAB_0015684c:
                      pdVar3 = x[0x12].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
                      if (pdVar3 == (double *)0x0) {
                        (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                             (_func_int **)local_228.m_data;
                        (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                             (_func_int **)local_228.m_rows;
                        local_228.m_data = (double *)0x0;
                        local_228.m_rows = 0;
                      }
                      else {
                        (**(code **)((long)*pdVar3 + 0x10))(this,pdVar3,&local_228);
                      }
                      free(local_228.m_data);
                      VVar27.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows = extraout_RDX;
                      VVar27.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = (double *)this;
                      return (Vector)VVar27.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage;
                    }
                  }
                }
              }
            }
          }
          __function = 
          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
          ;
          goto LAB_001568cb;
        }
      }
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001568cb:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::stateDynamics(const Vector & x, const Vector &, TimeIndex)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  // Vector3 accelerationFlex(x.segment(indexes::linAcc,3));
  Vector3 accelerationFlex(stabilizeAccelerationLinear(positionFlex, velocityFlex));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  // Vector3 angularAccelerationFlex(x.segment(indexes::angAcc,3));
  Vector3 angularAccelerationFlex(stabilizeAccelerationAngular(orientationFlexV, angularVelocityFlex));

  Quaternion orientationFlex(computeQuaternion_(orientationFlexV));

  kine::integrateKinematics(positionFlex, velocityFlex, accelerationFlex, orientationFlex, angularVelocityFlex,
                            angularAccelerationFlex, dt_);

  // x_{k+1}
  Vector xk1(x);

  xk1.segment(indexes::pos, 3) = positionFlex;
  xk1.segment(indexes::linVel, 3) = velocityFlex;
  xk1.segment(indexes::linAcc, 3) = accelerationFlex;

  AngleAxis orientationAA(orientationFlex);
  orientationFlexV = orientationAA.angle() * orientationAA.axis();

  xk1.segment(indexes::ori, 3) = orientationFlexV;
  xk1.segment(indexes::angVel, 3) = angularVelocityFlex;
  xk1.segment(indexes::angAcc, 3) = angularAccelerationFlex;

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}